

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

int connecting_getsock(Curl_easy *data,curl_socket_t *socks)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((data->conn != (connectdata *)0x0) && (iVar1 = data->conn->sock[0], iVar1 != -1)) {
    *socks = iVar1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int connecting_getsock(struct Curl_easy *data, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  (void)socks;
  /* Not using `conn->sockfd` as `Curl_setup_transfer()` initializes
   * that *after* the connect. */
  if(conn && conn->sock[FIRSTSOCKET] != CURL_SOCKET_BAD) {
    /* Default is to wait to something from the server */
    socks[0] = conn->sock[FIRSTSOCKET];
    return GETSOCK_READSOCK(0);
  }
  return GETSOCK_BLANK;
}